

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,Path *p)

{
  ostream *poVar1;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)p);
  poVar1 = std::operator<<(stream,local_30);
  std::__cxx11::string::_M_dispose();
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Path& p)
{
  return stream << p.str();
}